

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineSamplerTests.cpp
# Opt level: O0

void __thiscall
vkt::pipeline::anon_unknown_0::SamplerTest::SamplerTest
          (SamplerTest *this,TestContext *testContext,char *name,char *description,
          VkImageViewType imageViewType,VkFormat imageFormat,int imageSize,float samplerLod)

{
  char *__s;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_59;
  string local_58;
  float local_34;
  VkFormat local_30;
  float samplerLod_local;
  VkFormat imageFormat_local;
  VkImageViewType imageViewType_local;
  char *description_local;
  char *name_local;
  TestContext *testContext_local;
  SamplerTest *this_local;
  
  local_34 = samplerLod;
  local_30 = imageFormat;
  samplerLod_local = (float)imageViewType;
  _imageFormat_local = description;
  description_local = name;
  name_local = (char *)testContext;
  testContext_local = (TestContext *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,name,&local_59);
  __s = _imageFormat_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,__s,&local_91);
  TestCase::TestCase(&this->super_TestCase,testContext,&local_58,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SamplerTest_016a5e80;
  this->m_imageViewType = (VkImageViewType)samplerLod_local;
  this->m_imageFormat = local_30;
  this->m_imageSize = imageSize;
  ::vk::VkImageViewCreateInfo::VkImageViewCreateInfo(&this->m_imageViewParams);
  this->m_samplerLod = local_34;
  return;
}

Assistant:

SamplerTest::SamplerTest (tcu::TestContext&	testContext,
						  const char*		name,
						  const char*		description,
						  VkImageViewType	imageViewType,
						  VkFormat			imageFormat,
						  int				imageSize,
						  float				samplerLod)
	: vkt::TestCase		(testContext, name, description)
	, m_imageViewType	(imageViewType)
	, m_imageFormat		(imageFormat)
	, m_imageSize		(imageSize)
	, m_samplerLod		(samplerLod)
{
}